

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O0

int __thiscall MkvInterface::close(MkvInterface *this,int __fd)

{
  StdIOCallback *pSVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  EbmlMaster *Master;
  EbmlFloat *this_00;
  undefined4 extraout_var;
  uint64 uVar6;
  undefined4 extraout_var_00;
  uint64 origPos;
  KaxDuration *Duration;
  KaxInfo *MyInfos;
  MkvInterface *this_local;
  
  flushCluster(this);
  if ((this->m_file != (StdIOCallback *)0x0) && ((this->m_writeMode & 1U) != 0)) {
    if ((this->m_cues != (KaxCues *)0x0) &&
       (sVar5 = libebml::EbmlMaster::ListSize(&this->m_cues->super_EbmlMaster), sVar5 != 0)) {
      libmatroska::KaxCues::Render
                (this->m_cues,&this->m_file->super_IOCallback,(bool)(this->m_writeDefaultValues & 1)
                );
      libmatroska::KaxSeekHead::IndexThis
                (this->m_metaSeek,(EbmlElement *)this->m_cues,&this->m_fileSegment);
    }
    Master = &libebml::GetChild<libmatroska::KaxInfo>(&(this->m_fileSegment).super_EbmlMaster)->
              super_EbmlMaster;
    this_00 = &libebml::GetChild<libmatroska::KaxDuration>(Master)->super_EbmlFloat;
    libebml::EbmlFloat::operator=
              (this_00,(double)(this->m_frameDuration * (float)this->m_frameCount));
    (*(Master->super_EbmlElement)._vptr_EbmlElement[8])(Master,0);
    iVar4 = (*(this->m_file->super_IOCallback)._vptr_IOCallback[5])();
    pSVar1 = this->m_file;
    uVar6 = libebml::EbmlElement::GetElementPosition(&Master->super_EbmlElement);
    (*(pSVar1->super_IOCallback)._vptr_IOCallback[3])(pSVar1,uVar6,0);
    libebml::EbmlElement::Render
              (&Master->super_EbmlElement,&this->m_file->super_IOCallback,false,false,false);
    (*(this->m_file->super_IOCallback)._vptr_IOCallback[3])
              (this->m_file,CONCAT44(extraout_var,iVar4),0);
    libebml::EbmlVoid::ReplaceWith
              (this->m_dummy,(EbmlElement *)this->m_metaSeek,&this->m_file->super_IOCallback,true,
               false);
    (*(this->m_file->super_IOCallback)._vptr_IOCallback[3])(this->m_file,0,2);
    iVar4 = (*(this->m_file->super_IOCallback)._vptr_IOCallback[5])();
    uVar6 = libebml::EbmlElement::GetElementPosition((EbmlElement *)&this->m_fileSegment);
    bVar2 = libebml::EbmlElement::HeadSize((EbmlElement *)&this->m_fileSegment);
    bVar3 = libebml::EbmlElement::ForceSize
                      ((EbmlElement *)&this->m_fileSegment,
                       (CONCAT44(extraout_var_00,iVar4) - uVar6) - (ulong)bVar2);
    if (bVar3) {
      libebml::EbmlElement::OverwriteHead
                ((EbmlElement *)&this->m_fileSegment,&this->m_file->super_IOCallback,false);
    }
  }
  if (this->m_file != (StdIOCallback *)0x0) {
    (*(this->m_file->super_IOCallback)._vptr_IOCallback[6])();
    if (this->m_file != (StdIOCallback *)0x0) {
      (*(this->m_file->super_IOCallback)._vptr_IOCallback[1])();
    }
  }
  this->m_file = (StdIOCallback *)0x0;
  return (int)this;
}

Assistant:

void MkvInterface::close()
{
    flushCluster();
    
    if (m_file != NULL && m_writeMode)
    {
        if (m_cues != NULL && m_cues->ListSize() > 0)
        {
            m_cues->Render(*m_file, m_writeDefaultValues);
            m_metaSeek->IndexThis(*m_cues, m_fileSegment);
        }
        
        KaxInfo & MyInfos = GetChild<KaxInfo>(m_fileSegment);

        KaxDuration &Duration = GetChild<KaxDuration>(MyInfos);
        *(static_cast<EbmlFloat *>(&Duration)) = m_frameDuration * m_frameCount;

        MyInfos.UpdateSize();

        uint64 origPos = m_file->getFilePointer();
        m_file->setFilePointer(MyInfos.GetElementPosition());
        MyInfos.Render(*m_file);
        m_file->setFilePointer(origPos);
        
        // write the seek head
        m_dummy->ReplaceWith(*m_metaSeek, *m_file);
        
        m_file->setFilePointer(0, seek_end);
	    if (m_fileSegment.ForceSize(m_file->getFilePointer() -
                                    m_fileSegment.GetElementPosition() -
                                    m_fileSegment.HeadSize()))
            m_fileSegment.OverwriteHead(*m_file);
    }
    
    if (m_file != NULL)
    {
        m_file->close();
        delete m_file;
    }
    m_file = NULL;
}